

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void BrotliEncoderInitParams(BrotliEncoderParams *params)

{
  params->mode = BROTLI_MODE_GENERIC;
  params->quality = 0xb;
  params->large_window = 0;
  params->lgwin = 0x16;
  *(undefined8 *)&params->lgblock = 0;
  *(undefined8 *)((long)&params->size_hint + 4) = 0;
  BrotliInitEncoderDictionary(&params->dictionary);
  (params->dist).distance_postfix_bits = 0;
  (params->dist).num_direct_distance_codes = 0;
  (params->dist).alphabet_size = 0x40;
  (params->dist).max_distance = 0x3fffffc;
  return;
}

Assistant:

static void BrotliEncoderInitParams(BrotliEncoderParams* params) {
  params->mode = BROTLI_DEFAULT_MODE;
  params->large_window = BROTLI_FALSE;
  params->quality = BROTLI_DEFAULT_QUALITY;
  params->lgwin = BROTLI_DEFAULT_WINDOW;
  params->lgblock = 0;
  params->size_hint = 0;
  params->disable_literal_context_modeling = BROTLI_FALSE;
  BrotliInitEncoderDictionary(&params->dictionary);
  params->dist.distance_postfix_bits = 0;
  params->dist.num_direct_distance_codes = 0;
  params->dist.alphabet_size =
      BROTLI_DISTANCE_ALPHABET_SIZE(0, 0, BROTLI_MAX_DISTANCE_BITS);
  params->dist.max_distance = BROTLI_MAX_DISTANCE;
}